

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O2

void __thiscall CVmMetaTable::rebuild_image(CVmMetaTable *this,CVmImageWriter *writer)

{
  vm_meta_entry_t *this_00;
  vm_prop_id_t vVar1;
  ulong uVar2;
  ulong uVar3;
  
  CVmImageWriter::begin_meta_dep(writer,(int)this->count_);
  for (uVar3 = 0; uVar3 < this->count_; uVar3 = uVar3 + 1) {
    this_00 = this->table_ + (int)uVar3;
    CVmImageWriter::write_meta_dep_item(writer,this->table_[(int)uVar3].image_meta_name_);
    for (uVar2 = 1; (uVar2 & 0xffff) <= this_00->func_xlat_cnt_;
        uVar2 = (ulong)((int)(uVar2 & 0xffff) + 1)) {
      vVar1 = vm_meta_entry_t::xlat_func(this_00,(unsigned_short)uVar2);
      CVmImageWriter::write_meta_item_prop(writer,(uint)vVar1);
    }
  }
  CVmImageWriter::end_meta_dep(writer);
  return;
}

Assistant:

void CVmMetaTable::rebuild_image(CVmImageWriter *writer)
{
    size_t i;
    
    /* begin the new metaclass dependency table */
    writer->begin_meta_dep(get_count());

    /* write the new metaclass dependency table items */
    for (i = 0 ; i < get_count() ; ++i)
    {
        vm_meta_entry_t *entry;
        ushort j;

        /* get this entry */
        entry = get_entry(i);
        
        /* write this metaclass name */
        writer->write_meta_dep_item(entry->image_meta_name_);

        /* 
         *   Write the property translation list.  Note that xlat_func()
         *   requires a 1-based index, so we loop from 1 to the count,
         *   rather than following the usual C-style 0-based conventions.  
         */
        for (j = 1 ; j <= entry->func_xlat_cnt_ ; ++j)
            writer->write_meta_item_prop(entry->xlat_func(j));
    }
    
    /* end the metaclass dependency table */
    writer->end_meta_dep();
}